

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

char ** findKey(MAP_HANDLE_DATA *handleData,char *key)

{
  int iVar1;
  char **ppcVar2;
  size_t sVar3;
  
  ppcVar2 = handleData->keys;
  if (ppcVar2 != (char **)0x0) {
    for (sVar3 = handleData->count; sVar3 != 0; sVar3 = sVar3 - 1) {
      iVar1 = strcmp(*ppcVar2,key);
      if (iVar1 == 0) {
        return ppcVar2;
      }
      ppcVar2 = ppcVar2 + 1;
    }
  }
  return (char **)0x0;
}

Assistant:

static char** findKey(MAP_HANDLE_DATA* handleData, const char* key)
{
    char** result;
    if (handleData->keys == NULL)
    {
        result = NULL;
    }
    else
    {
        size_t i;
        result = NULL;
        for (i = 0; i < handleData->count; i++)
        {
            if (strcmp(handleData->keys[i], key) == 0)
            {
                result = handleData->keys + i;
                break;
            }
        }
    }
    return result;
}